

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cc
# Opt level: O0

char lf::mesh::to_char(Orientation o)

{
  undefined1 local_9;
  Orientation o_local;
  
  if (o == negative) {
    local_9 = '-';
  }
  else if (o == positive) {
    local_9 = '+';
  }
  else {
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

char to_char(Orientation o) {
  switch (o) {
    case lf::mesh::Orientation::positive: {
      return '+';
    }
    case lf::mesh::Orientation::negative: {
      return '-';
    }
  }
  return 0;
}